

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O2

FT_Error FT_Stroker_CubicTo(FT_Stroker stroker,FT_Vector *control1,FT_Vector *control2,FT_Vector *to
                           )

{
  FT_Vector *pFVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  FT_Pos FVar5;
  bool bVar6;
  int iVar7;
  FT_Error FVar8;
  ulong uVar9;
  FT_Angle FVar10;
  FT_Angle angle2;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  FT_Angle FVar19;
  FT_Angle FVar20;
  FT_Angle FVar21;
  FT_Fixed FVar22;
  FT_Long length;
  FT_Long FVar23;
  FT_Angle FVar24;
  FT_Fixed FVar25;
  FT_Long length_00;
  long lVar26;
  long dx;
  char *pcVar27;
  long dy;
  FT_StrokeBorder border;
  long dx_00;
  long dy_00;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  FT_Vector bez_stack [37];
  undefined1 local_120 [8];
  FT_Vector bvec;
  FT_Vector delta;
  undefined1 auStack_f8 [8];
  FT_Vector start;
  undefined1 local_e0 [8];
  FT_Vector ctrl1;
  FT_Vector ctrl2;
  FT_Angle local_90;
  undefined1 local_80 [8];
  FT_Vector end;
  
  if ((to == (FT_Vector *)0x0 || control2 == (FT_Vector *)0x0) ||
      (control1 == (FT_Vector *)0x0 || stroker == (FT_Stroker)0x0)) {
    FVar8 = 6;
  }
  else {
    pFVar1 = &stroker->center;
    if (((((2 < ((stroker->center).x - control1->x) + 1U) ||
          (2 < ((stroker->center).y - control1->y) + 1U)) || (2 < (control1->x - control2->x) + 1U))
        || ((2 < (control1->y - control2->y) + 1U || (2 < (control2->x - to->x) + 1U)))) ||
       (2 < (control2->y - to->y) + 1U)) {
      bez_stack[0].x = to->y;
      bez_stack[0].y = control2->x;
      bez_stack[1].x = control2->y;
      bez_stack[1].y = control1->x;
      bez_stack[2].x = control1->y;
      bez_stack[2].y = pFVar1->x;
      bez_stack[3].x = (stroker->center).y;
      bVar6 = false;
      lVar26 = 0;
      do {
        lVar26 = lVar26 + -0x30;
        while( true ) {
          uVar9 = lVar26 + 0x30;
          if ((long)uVar9 < 0) goto LAB_001f24da;
          FVar10 = stroker->angle_in;
          FVar21 = FVar10;
          angle2 = FVar10;
          if (0x1ff < uVar9) break;
          end.y = uVar9;
          lVar15 = *(long *)((long)&bez_stack[4].y + lVar26);
          lVar14 = *(long *)((long)&bez_stack[5].y + lVar26);
          lVar17 = *(long *)((long)&bez_stack[5].x + lVar26);
          lVar2 = *(long *)((long)&bez_stack[6].x + lVar26);
          lVar16 = *(long *)((long)&bez_stack[3].y + lVar26);
          dx_00 = lVar16 - lVar15;
          lVar3 = *(long *)((long)&bez_stack[4].x + lVar26);
          dy_00 = lVar3 - lVar17;
          lVar13 = *(long *)((long)&bez_stack[2].y + lVar26);
          lVar4 = *(long *)((long)&bez_stack[3].x + lVar26);
          dx = lVar13 - lVar16;
          dy = lVar4 - lVar3;
          bVar28 = 2 < dx_00 + 1U;
          bVar29 = 2 < dy_00 + 1U;
          bVar30 = 2 < dx + 1U;
          bVar31 = 2 < dy + 1U;
          if (((lVar15 - lVar14) + 1U < 3) && ((lVar17 - lVar2) + 1U < 3)) {
            if (bVar29 || bVar28) {
              FVar10 = FT_Atan2(dx_00,dy_00);
              FVar21 = FVar10;
              angle2 = FVar10;
              if (bVar31 || bVar30) {
                angle2 = FT_Atan2(dx,dy);
              }
            }
            else if (bVar31 || bVar30) {
              FVar10 = FT_Atan2(dx,dy);
              FVar21 = FVar10;
              angle2 = FVar10;
            }
          }
          else {
            FVar10 = FT_Atan2(lVar15 - lVar14,lVar17 - lVar2);
            if (bVar29 || bVar28) {
              FVar21 = FT_Atan2(dx_00,dy_00);
              angle2 = FVar21;
              if (bVar31 || bVar30) {
                angle2 = FT_Atan2(dx,dy);
              }
            }
            else {
              FVar21 = FVar10;
              angle2 = FVar10;
              if (bVar31 || bVar30) {
                angle2 = FT_Atan2(dx,dy);
                FVar21 = ft_angle_mean(FVar10,angle2);
              }
            }
          }
          pcVar11 = (char *)FT_Angle_Diff(FVar10,FVar21);
          pcVar27 = (char *)-(long)pcVar11;
          if (0 < (long)pcVar11) {
            pcVar27 = pcVar11;
          }
          pcVar12 = (char *)FT_Angle_Diff(FVar21,angle2);
          pcVar11 = (char *)-(long)pcVar12;
          if (0 < (long)pcVar12) {
            pcVar11 = pcVar12;
          }
          if ((pcVar27 < 
               "S5_ENSA_18_Mod_range_hashingENSA_20_Default_ranged_hashENSA_20_Prime_rehash_policyENSA_17_Hashtable_traitsILb1ELb0ELb1EEEE21_M_insert_unique_nodeEmmPNSA_10_Hash_nodeIS8_Lb1EEEm"
              ) && (pcVar11 < 
                    "S5_ENSA_18_Mod_range_hashingENSA_20_Default_ranged_hashENSA_20_Prime_rehash_policyENSA_17_Hashtable_traitsILb1ELb0ELb1EEEE21_M_insert_unique_nodeEmmPNSA_10_Hash_nodeIS8_Lb1EEEm"
                   )) break;
          if (stroker->first_point != '\0') {
            stroker->angle_in = FVar10;
          }
          *(long *)((long)&bez_stack[8].y + lVar26) = lVar14;
          lVar13 = (lVar13 + lVar16) / 2;
          *(long *)((long)&bez_stack[3].y + lVar26) = lVar13;
          lVar14 = (lVar14 + lVar15) / 2;
          *(long *)((long)&bez_stack[7].y + lVar26) = lVar14;
          lVar15 = (lVar16 + lVar15) / 2;
          lVar16 = (lVar13 + lVar15) / 2;
          *(long *)((long)&bez_stack[4].y + lVar26) = lVar16;
          lVar15 = (lVar15 + lVar14) / 2;
          *(long *)((long)&bez_stack[6].y + lVar26) = lVar15;
          *(long *)((long)&bez_stack[5].y + lVar26) = (lVar15 + lVar16) / 2;
          *(long *)((long)&bez_stack[9].x + lVar26) = lVar2;
          lVar15 = (lVar4 + lVar3) / 2;
          *(long *)((long)&bez_stack[4].x + lVar26) = lVar15;
          lVar14 = (lVar2 + lVar17) / 2;
          *(long *)((long)&bez_stack[8].x + lVar26) = lVar14;
          lVar17 = (lVar3 + lVar17) / 2;
          lVar15 = (lVar15 + lVar17) / 2;
          *(long *)((long)&bez_stack[5].x + lVar26) = lVar15;
          lVar14 = (lVar17 + lVar14) / 2;
          *(long *)((long)&bez_stack[7].x + lVar26) = lVar14;
          *(long *)((long)&bez_stack[6].x + lVar26) = (lVar14 + lVar15) / 2;
          lVar26 = end.y;
        }
        if (bVar6) {
          uVar18 = FT_Angle_Diff(stroker->angle_in,FVar10);
          uVar9 = -uVar18;
          if (0 < (long)uVar18) {
            uVar9 = uVar18;
          }
          if (0x5a000 < uVar9) {
            FVar5 = *(FT_Pos *)((long)&bez_stack[6].x + lVar26);
            pFVar1->x = *(FT_Pos *)((long)&bez_stack[5].y + lVar26);
            (stroker->center).y = FVar5;
            stroker->angle_out = FVar10;
            stroker->line_join = FT_STROKER_LINEJOIN_ROUND;
            iVar7 = ft_stroker_process_corner(stroker,0);
            stroker->line_join = stroker->line_join_saved;
            goto LAB_001f293d;
          }
        }
        else {
          if (stroker->first_point == '\0') {
            stroker->angle_out = FVar10;
            iVar7 = ft_stroker_process_corner(stroker,0);
          }
          else {
            iVar7 = ft_stroker_subpath_start(stroker,FVar10,0);
          }
LAB_001f293d:
          if (iVar7 != 0) {
            return iVar7;
          }
        }
        FVar19 = FT_Angle_Diff(FVar10,FVar21);
        FVar20 = FT_Angle_Diff(FVar21,angle2);
        end.y = FVar20 / 2;
        FVar10 = ft_angle_mean(FVar10,FVar21);
        FVar21 = ft_angle_mean(FVar21,angle2);
        FVar23 = stroker->radius;
        FVar22 = FT_Cos(FVar19 / 2);
        length = FT_DivFix(FVar23,FVar22);
        FVar23 = stroker->radius;
        FVar22 = FT_Cos(end.y);
        FVar23 = FT_DivFix(FVar23,FVar22);
        if (stroker->handle_wide_strokes == '\0') {
          local_90 = 0;
        }
        else {
          local_90 = FT_Atan2(*(long *)((long)&bez_stack[2].y + lVar26) -
                              *(long *)((long)&bez_stack[5].y + lVar26),
                              *(long *)((long)&bez_stack[3].x + lVar26) -
                              *(long *)((long)&bez_stack[6].x + lVar26));
        }
        lVar15 = 0;
        border = stroker->borders;
        while (lVar15 != -0x1680000) {
          FT_Vector_From_Polar((FT_Vector *)local_e0,length,FVar10 + 0x5a0000 + lVar15);
          local_e0 = (undefined1  [8])((long)local_e0 + *(long *)((long)&bez_stack[4].y + lVar26));
          ctrl1.x = ctrl1.x + *(long *)((long)&bez_stack[5].x + lVar26);
          FT_Vector_From_Polar((FT_Vector *)&ctrl1.y,FVar23,FVar21 + 0x5a0000 + lVar15);
          ctrl1.y = ctrl1.y + *(long *)((long)&bez_stack[3].y + lVar26);
          end.y = lVar15;
          FT_Vector_From_Polar((FT_Vector *)local_80,stroker->radius,angle2 + 0x5a0000 + lVar15);
          lVar15 = *(long *)((long)&bez_stack[2].y + lVar26);
          lVar14 = *(long *)((long)&bez_stack[3].x + lVar26);
          local_80 = (undefined1  [8])((long)local_80 + lVar15);
          end.x = end.x + lVar14;
          if (stroker->handle_wide_strokes == '\0') {
LAB_001f2cd9:
            iVar7 = ft_stroke_border_cubicto
                              (border,(FT_Vector *)local_e0,(FT_Vector *)&ctrl1.y,
                               (FT_Vector *)local_80);
          }
          else {
            lVar17 = border->points[border->num_points - 1].x;
            lVar2 = border->points[border->num_points - 1].y;
            auStack_f8 = (undefined1  [8])lVar17;
            start.x = lVar2;
            FVar19 = FT_Atan2((long)local_80 - lVar17,end.x - lVar2);
            uVar18 = FT_Angle_Diff(local_90,FVar19);
            uVar9 = -uVar18;
            if (0 < (long)uVar18) {
              uVar9 = uVar18;
            }
            if (uVar9 < 0x5a0001) goto LAB_001f2cd9;
            FVar20 = FT_Atan2(*(long *)((long)&bez_stack[5].y + lVar26) - lVar17,
                              *(long *)((long)&bez_stack[6].x + lVar26) - lVar2);
            FVar24 = FT_Atan2(lVar15 - (long)local_80,lVar14 - end.x);
            local_120 = (undefined1  [8])((long)local_80 - lVar17);
            bvec.x = end.x - lVar2;
            FVar22 = FT_Vector_Length((FT_Vector *)local_120);
            FVar25 = FT_Sin(FVar19 - FVar24);
            lVar15 = -FVar25;
            if (0 < FVar25) {
              lVar15 = FVar25;
            }
            FVar25 = FT_Sin(FVar20 - FVar24);
            lVar14 = -FVar25;
            if (0 < FVar25) {
              lVar14 = FVar25;
            }
            length_00 = FT_MulDiv(FVar22,lVar15,lVar14);
            FT_Vector_From_Polar((FT_Vector *)&bvec.y,length_00,FVar20);
            bvec.y = bvec.y + lVar17;
            border->movable = '\0';
            FVar8 = ft_stroke_border_lineto(border,(FT_Vector *)&bvec.y,'\0');
            if (FVar8 != 0) {
              return FVar8;
            }
            FVar8 = ft_stroke_border_lineto(border,(FT_Vector *)local_80,'\0');
            if (FVar8 != 0) {
              return FVar8;
            }
            FVar8 = ft_stroke_border_cubicto
                              (border,(FT_Vector *)&ctrl1.y,(FT_Vector *)local_e0,
                               (FT_Vector *)auStack_f8);
            if (FVar8 != 0) {
              return FVar8;
            }
            iVar7 = ft_stroke_border_lineto(border,(FT_Vector *)local_80,'\0');
          }
          if (iVar7 != 0) {
            return iVar7;
          }
          border = border + 1;
          lVar15 = end.y + -0xb40000;
        }
        stroker->angle_in = angle2;
        bVar6 = true;
      } while( true );
    }
LAB_001f24da:
    FVar5 = to->y;
    pFVar1->x = to->x;
    (stroker->center).y = FVar5;
    FVar8 = 0;
  }
  return FVar8;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Stroker_CubicTo( FT_Stroker  stroker,
                      FT_Vector*  control1,
                      FT_Vector*  control2,
                      FT_Vector*  to )
  {
    FT_Error    error = FT_Err_Ok;
    FT_Vector   bez_stack[37];
    FT_Vector*  arc;
    FT_Vector*  limit = bez_stack + 32;
    FT_Bool     first_arc = TRUE;


    if ( !stroker || !control1 || !control2 || !to )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* if all control points are coincident, this is a no-op; */
    /* avoid creating a spurious corner */
    if ( FT_IS_SMALL( stroker->center.x - control1->x ) &&
         FT_IS_SMALL( stroker->center.y - control1->y ) &&
         FT_IS_SMALL( control1->x       - control2->x ) &&
         FT_IS_SMALL( control1->y       - control2->y ) &&
         FT_IS_SMALL( control2->x       - to->x       ) &&
         FT_IS_SMALL( control2->y       - to->y       ) )
    {
       stroker->center = *to;
       goto Exit;
    }

    arc    = bez_stack;
    arc[0] = *to;
    arc[1] = *control2;
    arc[2] = *control1;
    arc[3] = stroker->center;

    while ( arc >= bez_stack )
    {
      FT_Angle  angle_in, angle_mid, angle_out;


      /* initialize with current direction */
      angle_in = angle_out = angle_mid = stroker->angle_in;

      if ( arc < limit                                         &&
           !ft_cubic_is_small_enough( arc, &angle_in,
                                      &angle_mid, &angle_out ) )
      {
        if ( stroker->first_point )
          stroker->angle_in = angle_in;

        ft_cubic_split( arc );
        arc += 3;
        continue;
      }

      if ( first_arc )
      {
        first_arc = FALSE;

        /* process corner if necessary */
        if ( stroker->first_point )
          error = ft_stroker_subpath_start( stroker, angle_in, 0 );
        else
        {
          stroker->angle_out = angle_in;
          error = ft_stroker_process_corner( stroker, 0 );
        }
      }
      else if ( ft_pos_abs( FT_Angle_Diff( stroker->angle_in, angle_in ) ) >
                  FT_SMALL_CUBIC_THRESHOLD / 4                             )
      {
        /* if the deviation from one arc to the next is too great, */
        /* add a round corner                                      */
        stroker->center    = arc[3];
        stroker->angle_out = angle_in;
        stroker->line_join = FT_STROKER_LINEJOIN_ROUND;

        error = ft_stroker_process_corner( stroker, 0 );

        /* reinstate line join style */
        stroker->line_join = stroker->line_join_saved;
      }

      if ( error )
        goto Exit;

      /* the arc's angle is small enough; we can add it directly to each */
      /* border                                                          */
      {
        FT_Vector        ctrl1, ctrl2, end;
        FT_Angle         theta1, phi1, theta2, phi2, rotate, alpha0 = 0;
        FT_Fixed         length1, length2;
        FT_StrokeBorder  border;
        FT_Int           side;


        theta1  = FT_Angle_Diff( angle_in,  angle_mid ) / 2;
        theta2  = FT_Angle_Diff( angle_mid, angle_out ) / 2;
        phi1    = ft_angle_mean( angle_in,  angle_mid );
        phi2    = ft_angle_mean( angle_mid, angle_out );
        length1 = FT_DivFix( stroker->radius, FT_Cos( theta1 ) );
        length2 = FT_DivFix( stroker->radius, FT_Cos( theta2 ) );

        /* compute direction of original arc */
        if ( stroker->handle_wide_strokes )
          alpha0 = FT_Atan2( arc[0].x - arc[3].x, arc[0].y - arc[3].y );

        for ( border = stroker->borders, side = 0;
              side <= 1;
              side++, border++ )
        {
          rotate = FT_SIDE_TO_ROTATE( side );

          /* compute control points */
          FT_Vector_From_Polar( &ctrl1, length1, phi1 + rotate );
          ctrl1.x += arc[2].x;
          ctrl1.y += arc[2].y;

          FT_Vector_From_Polar( &ctrl2, length2, phi2 + rotate );
          ctrl2.x += arc[1].x;
          ctrl2.y += arc[1].y;

          /* compute end point */
          FT_Vector_From_Polar( &end, stroker->radius, angle_out + rotate );
          end.x += arc[0].x;
          end.y += arc[0].y;

          if ( stroker->handle_wide_strokes )
          {
            FT_Vector  start;
            FT_Angle   alpha1;


            /* determine whether the border radius is greater than the */
            /* radius of curvature of the original arc                 */
            start = border->points[border->num_points - 1];

            alpha1 = FT_Atan2( end.x - start.x, end.y - start.y );

            /* is the direction of the border arc opposite to */
            /* that of the original arc? */
            if ( ft_pos_abs( FT_Angle_Diff( alpha0, alpha1 ) ) >
                   FT_ANGLE_PI / 2                             )
            {
              FT_Angle   beta, gamma;
              FT_Vector  bvec, delta;
              FT_Fixed   blen, sinA, sinB, alen;


              /* use the sine rule to find the intersection point */
              beta  = FT_Atan2( arc[3].x - start.x, arc[3].y - start.y );
              gamma = FT_Atan2( arc[0].x - end.x,   arc[0].y - end.y );

              bvec.x = end.x - start.x;
              bvec.y = end.y - start.y;

              blen = FT_Vector_Length( &bvec );

              sinA = ft_pos_abs( FT_Sin( alpha1 - gamma ) );
              sinB = ft_pos_abs( FT_Sin( beta - gamma ) );

              alen = FT_MulDiv( blen, sinA, sinB );

              FT_Vector_From_Polar( &delta, alen, beta );
              delta.x += start.x;
              delta.y += start.y;

              /* circumnavigate the negative sector backwards */
              border->movable = FALSE;
              error = ft_stroke_border_lineto( border, &delta, FALSE );
              if ( error )
                goto Exit;
              error = ft_stroke_border_lineto( border, &end, FALSE );
              if ( error )
                goto Exit;
              error = ft_stroke_border_cubicto( border,
                                                &ctrl2,
                                                &ctrl1,
                                                &start );
              if ( error )
                goto Exit;
              /* and then move to the endpoint */
              error = ft_stroke_border_lineto( border, &end, FALSE );
              if ( error )
                goto Exit;

              continue;
            }

            /* else fall through */
          }

          /* simply add an arc */
          error = ft_stroke_border_cubicto( border, &ctrl1, &ctrl2, &end );
          if ( error )
            goto Exit;
        }
      }

      arc -= 3;

      stroker->angle_in = angle_out;
    }

    stroker->center = *to;

  Exit:
    return error;
  }